

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalEffects.cpp
# Opt level: O0

void __thiscall wasm::DiscardGlobalEffects::~DiscardGlobalEffects(DiscardGlobalEffects *this)

{
  DiscardGlobalEffects *this_local;
  
  ~DiscardGlobalEffects(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

void run(Module* module) override { getPassOptions().funcEffectsMap.reset(); }